

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void MemHashUnlinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pEntry)

{
  SyMemBackend *pAlloc;
  sxu32 nBucket;
  mem_hash_record *pEntry_local;
  mem_hash_kv_engine *pEngine_local;
  
  if (pEntry->pPrevHash == (mem_hash_record *)0x0) {
    pEngine->apBucket[pEntry->nHash & pEngine->nBucket - 1] = pEntry->pNextHash;
  }
  else {
    pEntry->pPrevHash->pNextHash = pEntry->pNextHash;
  }
  if (pEntry->pNextHash != (mem_hash_record *)0x0) {
    pEntry->pNextHash->pPrevHash = pEntry->pPrevHash;
  }
  if (pEngine->pLast == pEntry) {
    pEngine->pLast = pEngine->pLast->pNext;
  }
  if (pEntry->pPrev != (mem_hash_record *)0x0) {
    pEntry->pPrev->pNext = pEntry->pNext;
  }
  if (pEntry->pNext != (mem_hash_record *)0x0) {
    pEntry->pNext->pPrev = pEntry->pPrev;
  }
  if (pEntry == pEngine->pFirst) {
    pEngine->pFirst = pEntry->pPrev;
  }
  pEngine->nRecord = pEngine->nRecord - 1;
  SyMemBackendFree(&pEngine->sAlloc,pEntry->pData);
  SyMemBackendFree(&pEngine->sAlloc,pEntry);
  return;
}

Assistant:

static void MemHashUnlinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pEntry)
{
	sxu32 nBucket = pEntry->nHash & (pEngine->nBucket - 1);
	SyMemBackend *pAlloc = &pEngine->sAlloc;
	if( pEntry->pPrevHash == 0 ){
		pEngine->apBucket[nBucket] = pEntry->pNextHash;
	}else{
		pEntry->pPrevHash->pNextHash = pEntry->pNextHash;
	}
	if( pEntry->pNextHash ){
		pEntry->pNextHash->pPrevHash = pEntry->pPrevHash;
	}
	MACRO_LD_REMOVE(pEngine->pLast,pEntry);
	if( pEntry == pEngine->pFirst ){
		pEngine->pFirst = pEntry->pPrev;
	}
	pEngine->nRecord--;
	/* Release the entry */
	SyMemBackendFree(pAlloc,(void *)pEntry->pData);
	SyMemBackendFree(pAlloc,pEntry); /* Key is also stored here */
}